

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

db_bit * __thiscall lan::db::read_value_bit(db *this,string *content,bool in_array)

{
  db_bit *pdVar1;
  long lVar2;
  logic_error *this_00;
  char *pcVar3;
  bool local_1a1;
  bool local_189;
  byte local_179;
  string local_178;
  string local_158;
  byte local_131;
  string local_130;
  string local_110;
  undefined1 local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  byte local_a1;
  string local_a0;
  byte local_7d;
  string local_70;
  db_bit *local_50;
  db_bit *bit;
  db_bit_type type;
  char c_type;
  string name;
  bool in_array_local;
  string *content_local;
  db *this_local;
  
  name.field_2._M_local_buf[0xf] = in_array;
  std::__cxx11::string::string((string *)&type);
  bit._0_4_ = Unsafe;
  local_50 = (db_bit *)0x0;
  local_7d = 0;
  local_a1 = 0;
  local_179 = 0;
  if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
    pop_next(&local_70,this,content);
    local_7d = 1;
    std::__cxx11::string::operator=((string *)&type,(string *)&local_70);
    lVar2 = std::__cxx11::string::length();
    local_189 = false;
    if (lVar2 != 0) {
      pop_next(&local_a0,this,content);
      local_a1 = 1;
      local_189 = std::operator==(&local_a0,"=");
    }
    local_179 = local_189 ^ 0xff;
  }
  if ((local_a1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_7d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_179 & 1) != 0) {
    local_e9 = 1;
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_e8,"LANDB (pull_error): unable read value bit <",&local_50->key);
    std::operator+(&local_c8,&local_e8,">, invalid sintax.");
    std::logic_error::logic_error(this_00,(string *)&local_c8);
    local_e9 = 0;
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_131 = 0;
  pop_next(&local_110,this,content);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&local_110);
  bit._7_1_ = *pcVar3;
  local_1a1 = false;
  if (bit._7_1_ != '\0') {
    pop_next(&local_130,this,content);
    local_131 = 1;
    local_1a1 = std::operator==(&local_130,":");
  }
  if ((local_131 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_130);
  }
  std::__cxx11::string::~string((string *)&local_110);
  if (local_1a1 != false) {
    bit._0_4_ = convert_to_bit_type(this,bit._7_1_);
    if ((db_bit_type)bit == Array) {
      std::__cxx11::string::string((string *)&local_158,(string *)&type);
      local_50 = read_array_bit(this,&local_158,content);
      std::__cxx11::string::~string((string *)&local_158);
    }
    else {
      std::__cxx11::string::string((string *)&local_178,(string *)&type);
      local_50 = read_var_bit(this,&local_178,(db_bit_type)bit,content);
      std::__cxx11::string::~string((string *)&local_178);
    }
  }
  pdVar1 = local_50;
  std::__cxx11::string::~string((string *)&type);
  return pdVar1;
}

Assistant:

lan::db_bit * db::read_value_bit(std::string & content, bool in_array){
            std::string name;
            char c_type;
            db_bit_type type = Unsafe;
            lan::db_bit * bit = nullptr;
            if(!in_array and !((name = pop_next(content)).length() and (pop_next(content) == "="))){
                throw lan::errors::pull_error ("LANDB (pull_error): unable read value bit <" + bit->key + ">, invalid sintax.");
            } if( (c_type = pop_next(content)[0]) and (pop_next(content) == ":")){
                type = convert_to_bit_type(c_type);
                switch(type){
                    case Array: bit = read_array_bit(name, content); break;
                    default: bit = read_var_bit(name, type, content); break;
                } 
            } return bit;
        }